

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

int __thiscall
GrcFont::GetGlyphMetric(GrcFont *this,gid16 wGlyphID,GlyphMetric gmet,GdlObject *pgdlobj)

{
  bool bVar1;
  int iVar2;
  size_type_conflict sVar3;
  reference pvVar4;
  int in_EDX;
  int j;
  int i;
  int cEndPoints;
  int nSecondPt;
  int nFirstPt;
  int yMax;
  int xMax;
  int yMin;
  int xMin;
  vector<bool,_std::allocator<bool>_> vfOnCurve;
  vector<int,_std::allocator<int>_> vnY;
  vector<int,_std::allocator<int>_> vnX;
  vector<int,_std::allocator<int>_> vnEndPt;
  int nLsb;
  uint nAdvWid;
  void *in_stack_fffffffffffffd90;
  void *in_stack_fffffffffffffd98;
  allocator *paVar5;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb4;
  gid16 in_stack_fffffffffffffdb6;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  string *in_stack_fffffffffffffdc8;
  string *staMsg;
  GdlObject *in_stack_fffffffffffffdd0;
  GdlObject *pgdlobj_00;
  undefined8 in_stack_fffffffffffffdd8;
  undefined1 *puVar6;
  int nID;
  GrcErrorList *in_stack_fffffffffffffde0;
  GrcErrorList *this_00;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [32];
  undefined4 local_188;
  int local_184;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  undefined1 local_160 [64];
  undefined1 local_120 [24];
  vector<int,_std::allocator<int>_> local_108;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [14];
  gid16 in_stack_ffffffffffffff6e;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  int local_28;
  int local_24;
  int local_18;
  int local_4;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
  if (in_EDX == 9) {
    return 0;
  }
  if (in_EDX == 10) {
    iVar2 = TtfUtil::FontAscent(in_stack_fffffffffffffd90);
    return iVar2;
  }
  if (in_EDX == 0xb) {
    iVar2 = TtfUtil::FontDescent(in_stack_fffffffffffffd90);
    return iVar2;
  }
  local_18 = in_EDX;
  if (((in_EDX == 8) || (in_EDX == 0)) || (in_EDX == 1)) {
    bVar1 = TtfUtil::HorMetrics((gid16)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                                in_stack_fffffffffffffdc8,
                                CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                                (void *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8
                                                ),
                                (int *)CONCAT26(in_stack_fffffffffffffdb6,
                                                CONCAT24(in_stack_fffffffffffffdb4,
                                                         in_stack_fffffffffffffdb0)),
                                (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Unable to get horizontal metrics for glyph ",&local_49)
      ;
      GdlGlyphDefn::GlyphIDString_abi_cxx11_(in_stack_ffffffffffffff6e);
      GrcErrorList::AddError
                (in_stack_fffffffffffffde0,iVar2,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8
                 ,(string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      return -0x80000000;
    }
    if (local_18 == 0) {
      return local_28;
    }
    if (local_18 == 8) {
      return local_24;
    }
  }
  bVar1 = TtfUtil::IsSpace(in_stack_fffffffffffffdb6,
                           (void *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                           (size_t)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  if (bVar1) {
    if (local_18 == 1) {
      return local_24;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,"Requesting bounding box metric for white space glyph ",&local_a1);
    GdlGlyphDefn::GlyphIDString_abi_cxx11_(in_stack_ffffffffffffff6e);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"; 0 will be used",&local_e9);
    GrcErrorList::AddWarning
              (in_stack_fffffffffffffde0,iVar2,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
               (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               (string *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    return 0;
  }
  staMsg = (string *)&local_108;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b3485);
  pgdlobj_00 = (GdlObject *)local_120;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b3497);
  puVar6 = local_160 + 0x28;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b34a9);
  this_00 = (GrcErrorList *)local_160;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)0x1b34bb);
  local_164 = 0x7fffffff;
  local_168 = 0x7fffffff;
  local_16c = -0x80000000;
  local_170 = -0x80000000;
  iVar2 = GetGlyfPts((GrcFont *)
                     vnY.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     vnY.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start._6_2_,
                     (vector<int,_std::allocator<int>_> *)
                     vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage,
                     (vector<int,_std::allocator<int>_> *)
                     vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_,
                     (vector<int,_std::allocator<int>_> *)
                     vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p,
                     (vector<bool,_std::allocator<bool>_> *)
                     vfOnCurve.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_);
  nID = (int)((ulong)puVar6 >> 0x20);
  if (iVar2 == 0) {
switchD_001b3739_default:
    paVar5 = &local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a8,"Unable to get bounding box for glyph ",paVar5);
    GdlGlyphDefn::GlyphIDString_abi_cxx11_(in_stack_ffffffffffffff6e);
    GrcErrorList::AddWarning
              (this_00,nID,pgdlobj_00,staMsg,
               (string *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    local_4 = -0x80000000;
  }
  else {
    local_174 = 0;
    local_178 = -1;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_108);
    local_17c = (int)sVar3;
    for (local_180 = 0; nID = (int)((ulong)puVar6 >> 0x20), local_180 < local_17c;
        local_180 = local_180 + 1) {
      local_174 = local_178 + 1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_180);
      local_178 = *pvVar4;
      if (local_178 != local_174) {
        for (local_184 = local_174; local_184 <= local_178; local_184 = local_184 + 1) {
          in_stack_fffffffffffffdc0 = local_164;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_120,(long)local_184);
          in_stack_fffffffffffffdc4 = gr::Min<int>(in_stack_fffffffffffffdc0,*pvVar4);
          iVar2 = local_168;
          local_164 = in_stack_fffffffffffffdc4;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_160 + 0x28),
                              (long)local_184);
          local_168 = gr::Min<int>(iVar2,*pvVar4);
          iVar2 = local_16c;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_120,(long)local_184);
          local_16c = gr::Max<int>(iVar2,*pvVar4);
          iVar2 = local_170;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(local_160 + 0x28),
                              (long)local_184);
          local_170 = gr::Max<int>(iVar2,*pvVar4);
        }
      }
    }
    in_stack_fffffffffffffda0 = (vector<int,_std::allocator<int>_> *)(ulong)(local_18 - 1);
    switch(in_stack_fffffffffffffda0) {
    case (vector<int,_std::allocator<int>_> *)0x0:
      local_4 = (local_24 - local_28) - (local_16c - local_164);
      break;
    case (vector<int,_std::allocator<int>_> *)0x1:
      local_4 = local_170;
      break;
    case (vector<int,_std::allocator<int>_> *)0x2:
      local_4 = local_168;
      break;
    case (vector<int,_std::allocator<int>_> *)0x3:
      local_4 = local_164;
      break;
    case (vector<int,_std::allocator<int>_> *)0x4:
      local_4 = local_16c;
      break;
    case (vector<int,_std::allocator<int>_> *)0x5:
      local_4 = local_170 - local_168;
      break;
    case (vector<int,_std::allocator<int>_> *)0x6:
      local_4 = local_16c - local_164;
      break;
    default:
      goto switchD_001b3739_default;
    }
  }
  local_188 = 1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1b3964)
  ;
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffda0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffda0);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffda0);
  return local_4;
}

Assistant:

int GrcFont::GetGlyphMetric(gid16 wGlyphID, GlyphMetric gmet, GdlObject * pgdlobj)
{
	Assert(m_pFile);
	Assert(m_pLoca);
	Assert(m_pGlyf);
	Assert(m_pOs2);
	Assert(m_pHmtx);
	Assert(m_pHhea);

	switch(gmet)
	{
	case kgmetAscent:
		return TtfUtil::FontAscent(m_pOs2);
	case kgmetDescent:
		return TtfUtil::FontDescent(m_pOs2);
	case kgmetAdvHeight: // TODO AlanW (SharonC): eventually the vmtx table will be needed?
		return 0;
	default:
		break;	// fall through
	}

	unsigned int nAdvWid;
    int nLsb;
	if (gmet == kgmetAdvWidth || gmet == kgmetLsb || gmet == kgmetRsb)
	{
		if (!TtfUtil::HorMetrics(wGlyphID, m_pHmtx, m_cHmtx, m_pHhea, nLsb, nAdvWid))
		{
			g_errorList.AddError(120, pgdlobj, 
				"Unable to get horizontal metrics for glyph ", 
				GdlGlyphDefn::GlyphIDString(wGlyphID));
			return INT_MIN;
		}

		switch(gmet)
		{
		case kgmetAdvWidth:
			return nAdvWid;
		case kgmetLsb: // Review: should we return xMin instead?
			return nLsb;
		default:
		    break;
		// handle Rsb below
		}
	}

	if (TtfUtil::IsSpace(wGlyphID, m_pLoca, m_cLoca, m_pHead))
	{
		if (gmet == kgmetRsb)
			return nAdvWid; // for space. RSB same as adv width to agree with compiler

		g_errorList.AddWarning(509, pgdlobj, 
			"Requesting bounding box metric for white space glyph ", 
			GdlGlyphDefn::GlyphIDString(wGlyphID), 
			"; 0 will be used");
		return 0; // for space, all BB metrics are zero
	}

	// Find bounding box metrics.
	/*
	Normally would use TtfUtil::GlyfBox but attachment points alter the metrics as follows.
	Normally the min and max values stored for each glyph also reflect the visual
	appearance of the glyph. When attachment points are added the min and max values
	may increase but the appearance of the glyph (the black part) will not change since
	attachment points aren't visible. We want the metrics returned here to match the 
	appearance of the the glyph and not be the min and max values with attachment points.
	The GDL author will be familiar with former which is also more intuitive to use.
	The font could be adjusted so attachment points don't affect min and max values
	but that would add a step to the font production process and may produce
	unexpected side effects.
	The bounding box metrics returned from Windows (GetGlyphMetrics) disregard the
	min and max values for each glyph and match the visual appearance. Presumably this
	is related to the way the Windows rasterizer discards attachment points. This means
	the Graphite engine should obtain the same metrics as are returned here.
	Attachment points in this context are points that are alone on their own
	contour (or path), so they can easily be referenced by path number (GPath in GDL).
	*/

	std::vector<int> vnEndPt, vnX, vnY;
	std::vector<bool> vfOnCurve;

	int xMin = INT_MAX;
	int yMin = INT_MAX;
	int xMax = INT_MIN;
	int yMax = INT_MIN;

	if (GetGlyfPts(wGlyphID, &vnEndPt, &vnX, &vnY, &vfOnCurve))
	{
		int nFirstPt = 0;
		int nSecondPt = -1;	// so nFirstPt initialized to zero in loop below
		int cEndPoints = signed(vnEndPt.size());
		int i, j;
		for (i = 0; i < cEndPoints; i++)
		{
			nFirstPt = nSecondPt + 1;
			nSecondPt = vnEndPt[i];
			if (nSecondPt - nFirstPt) // throw out point on contour with single point
			{
				for (j = nFirstPt; j <= nSecondPt; j++)
				{
					xMin = Min(xMin, vnX[j]);
					yMin = Min(yMin, vnY[j]);
					xMax = Max(xMax, vnX[j]);
					yMax = Max(yMax, vnY[j]);
				}
			}
		}

		switch(gmet)
		{
		case kgmetBbTop:
			return yMax;
		case kgmetBbBottom:
			return yMin;
		case kgmetBbLeft:
			return xMin;
		case kgmetBbRight:
			return xMax;
		case kgmetBbWidth:
			return xMax - xMin;
		case kgmetBbHeight:
			return yMax - yMin;
		case kgmetRsb:
			return nAdvWid - nLsb - (xMax - xMin);
		default:
		    break;
		}
	}

	g_errorList.AddWarning(121, pgdlobj, 
		"Unable to get bounding box for glyph ", 
		GdlGlyphDefn::GlyphIDString(wGlyphID));
	return INT_MIN;
}